

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_padding.cpp
# Opt level: O3

void test_2d_dynamic<0ul,5ul,1ul,30ul>(void)

{
  pointer piVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  char *local_58;
  char *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 1;
  local_50._0_1_ = 1;
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
  ;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7a,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&local_48,
             (bool *)&local_50);
  lVar4 = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_50._0_1_ = 0;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7c,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&local_48,
             (bool *)&local_50);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_50 = (char *)CONCAT71(local_50._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7d,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",(bool *)&local_48,
             (bool *)&local_50);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_50 = (char *)CONCAT44(local_50._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x7f,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_48,(int *)&local_50);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_50 = (char *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","N + X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x80,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_48,(unsigned_long *)&local_50);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1e;
  local_50 = (char *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x82,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_48,(unsigned_long *)&local_50);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_00000023;
  local_50 = (char *)0x23;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x83,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)&local_48,(unsigned_long *)&local_50);
  local_50 = (char *)CONCAT44(local_50._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,0x23,(value_type_conflict1 *)&local_50,(allocator_type *)&local_58);
  piVar1 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar3 = (char *)0x0;
  do {
    local_58 = pcVar3;
    local_50 = pcVar3;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x91,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_58,(unsigned_long *)&local_50);
    if ((char *)0x1d < pcVar3) {
      *(undefined4 *)((long)piVar1 + lVar4) = 0x18;
      local_58._0_4_ = 0x18;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xa3,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)piVar1 + lVar4),(int *)&local_58);
      if ((char *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) <= pcVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pcVar3);
        goto LAB_001071c3;
      }
      local_58 = (char *)CONCAT44(local_58._4_4_,0x18);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xa6,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4),(int *)&local_58);
    }
    pcVar3 = pcVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (pcVar3 != (char *)0x23);
  lVar4 = 0;
  pcVar5 = (char *)0x0;
  do {
    local_58 = pcVar5;
    local_50 = pcVar5;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0xb0,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_58,(unsigned_long *)&local_50);
    if (pcVar5 < (char *)0x1e) {
      local_58 = (char *)CONCAT44(local_58._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,199,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)piVar1 + lVar4),(int *)&local_58);
    }
    else {
      local_58._0_4_ = 0x18;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xbe,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)piVar1 + lVar4),(int *)&local_58);
      if ((char *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) <= pcVar5) {
LAB_001071c3:
        uVar2 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,pcVar5);
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar2);
      }
      local_58 = (char *)CONCAT44(local_58._4_4_,0x18);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i, j)))","24",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
                 ,0xc1,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                 (int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4),(int *)&local_58);
    }
    pcVar5 = pcVar5 + 1;
    lVar4 = lVar4 + 4;
    if (pcVar5 == (char *)0x23) {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<dyn, dyn>
    > const l{{X, Y}, {}, {N, M}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), N + X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    // Initialize all elements to 42.
    vector<int> data(
        (l[0] + l.pads()[0]) * (l[1] + l.pads()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}